

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

int16_t FAudio_INTERNAL_ParseNibble
                  (uint8_t nibble,uint8_t predictor,int16_t *delta,int16_t *sample1,int16_t *sample2
                  )

{
  uint uVar1;
  short sVar2;
  short sVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  undefined3 in_register_00000039;
  uint uVar5;
  int iVar6;
  
  uVar5 = CONCAT31(in_register_00000039,nibble);
  uVar1 = uVar5 - 0x10 & 0xff;
  if ((nibble & 8) == 0) {
    uVar1 = uVar5;
  }
  uVar4 = (ulong)(uint)((int)CONCAT71(in_register_00000031,predictor) << 2);
  iVar6 = ((int)*sample2 * *(int *)((long)FAudio_INTERNAL_ParseNibble::AdaptCoeff_2 + uVar4) +
          (int)*sample1 * *(int *)((long)FAudio_INTERNAL_ParseNibble::AdaptCoeff_1 + uVar4)) / 0x100
          + (int)*delta * (int)(char)uVar1;
  if (iVar6 < -0x7fff) {
    iVar6 = -0x8000;
  }
  if (0x7ffe < iVar6) {
    iVar6 = 0x7fff;
  }
  *sample2 = *sample1;
  *sample1 = (int16_t)iVar6;
  sVar2 = (short)((long)((int)*delta * FAudio_INTERNAL_ParseNibble::AdaptionTable[uVar5]) / 0x100);
  sVar3 = 0x10;
  if (0x10 < sVar2) {
    sVar3 = sVar2;
  }
  *delta = sVar3;
  return (int16_t)iVar6;
}

Assistant:

static inline int16_t FAudio_INTERNAL_ParseNibble(
	uint8_t nibble,
	uint8_t predictor,
	int16_t *delta,
	int16_t *sample1,
	int16_t *sample2
) {
	static const int32_t AdaptionTable[16] =
	{
		230, 230, 230, 230, 307, 409, 512, 614,
		768, 614, 512, 409, 307, 230, 230, 230
	};
	static const int32_t AdaptCoeff_1[7] =
	{
		256, 512, 0, 192, 240, 460, 392
	};
	static const int32_t AdaptCoeff_2[7] =
	{
		0, -256, 0, 64, 0, -208, -232
	};

	int8_t signedNibble;
	int32_t sampleInt;
	int16_t sample;

	signedNibble = (int8_t) nibble;
	if (signedNibble & 0x08)
	{
		signedNibble -= 0x10;
	}

	sampleInt = (
		(*sample1 * AdaptCoeff_1[predictor]) +
		(*sample2 * AdaptCoeff_2[predictor])
	) / 256;
	sampleInt += signedNibble * (*delta);
	sample = FAudio_clamp(sampleInt, -32768, 32767);

	*sample2 = *sample1;
	*sample1 = sample;
	*delta = (int16_t) (AdaptionTable[nibble] * (int32_t) (*delta) / 256);
	if (*delta < 16)
	{
		*delta = 16;
	}
	return sample;
}